

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-check.c
# Opt level: O3

int check_data(coda_cursor *cursor,coda_type **definition,int read_check,int size_check,
              int64_t *bit_size,_func_void_coda_cursor_ptr_char_ptr_void_ptr *callbackfunc,
              void *userdata)

{
  uint8_t uVar1;
  coda_expression *expr;
  coda_dynamic_type_struct *pcVar2;
  coda_product *product;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double *dst;
  int *piVar7;
  char *pcVar8;
  undefined4 *puVar9;
  size_t sVar10;
  long lVar11;
  coda_type *pcVar12;
  char *pcVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  coda_type *__size;
  int has_attributes;
  int available_definition;
  coda_type_class type_class_1;
  coda_type_class definition_type_class;
  coda_type_class type_class;
  coda_type *type;
  long index;
  char *real_name;
  long num_fields;
  coda_native_type read_type;
  uint8_t *local_4f8;
  long local_4f0;
  uint local_4d4;
  uint local_4d0;
  undefined4 uStack_4cc;
  coda_type_class local_4c8;
  undefined4 uStack_4c4;
  coda_type_class local_4c0;
  undefined4 uStack_4bc;
  coda_type_class local_4b4;
  coda_type *local_4b0;
  undefined8 local_4a8;
  undefined8 local_488;
  char *local_460;
  undefined8 *local_458;
  char *local_450;
  coda_type *local_448 [32];
  coda_cursor local_348;
  
  if (bit_size == (int64_t *)0x0) {
    __assert_fail("bit_size != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                  ,0x132,
                  "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                 );
  }
  iVar4 = coda_cursor_get_type(cursor,&local_4b0);
  if (iVar4 != 0) {
    return -1;
  }
  iVar4 = coda_type_get_class(local_4b0,&local_4b4);
  if (iVar4 != 0) {
    return -1;
  }
  if (*definition == (coda_type *)0x0) goto switchD_00124420_caseD_4;
  iVar4 = coda_cursor_get_type_class(cursor,&local_4c8);
  if (iVar4 != 0) {
    return -1;
  }
  iVar4 = coda_type_get_class(*definition,&local_4c0);
  if (iVar4 != 0) {
    return -1;
  }
  if (local_4c8 == local_4c0) {
    switch(local_4c8) {
    case coda_record_class:
      pcVar12 = *definition;
      iVar4 = coda_cursor_get_type(cursor,(coda_type **)&local_348);
      if (iVar4 != 0) {
        return -1;
      }
      if (0 < (long)pcVar12[1].name) {
        piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
        lVar11 = 0;
        do {
          local_4d0 = 1;
          local_4d4 = 1;
          iVar4 = coda_cursor_get_record_field_index_from_name
                            (cursor,(char *)**(undefined8 **)(pcVar12[1].description + lVar11 * 8),
                             &local_4a8);
          if (iVar4 == 0) {
            iVar4 = coda_cursor_get_record_field_available_status
                              (cursor,CONCAT44(local_4a8._4_4_,(int)local_4a8),(int *)&local_4d4);
            if (iVar4 != 0) {
              return -1;
            }
          }
          else {
            if (*piVar7 != -0x66) {
              return -1;
            }
            *piVar7 = 0;
            local_4d4 = 0;
          }
          if (*(char *)(*(long *)(pcVar12[1].description + lVar11 * 8) + 0x1c) == '\0') {
LAB_001248c9:
            if (local_4d0 == 0xffffffff) goto LAB_00124951;
            uVar5 = local_4d0;
            if (local_4d4 != local_4d0) {
              pcVar13 = "available";
              pcVar8 = "available";
              if (local_4d4 == 0) {
                pcVar8 = "unavailable";
              }
              if (local_4d0 == 0) {
                pcVar13 = "unavailable";
              }
              coda_set_error(-300,"field \'%s\' availability (%s) does not match definition (%s)",
                             **(undefined8 **)(pcVar12[1].description + lVar11 * 8),pcVar8,pcVar13);
              pcVar8 = coda_errno_to_string(*piVar7);
              (*callbackfunc)(cursor,pcVar8,userdata);
              *piVar7 = 0;
              uVar5 = local_4d0;
            }
          }
          else {
            expr = *(coda_expression **)(*(long *)(pcVar12[1].description + lVar11 * 8) + 0x20);
            if (expr != (coda_expression *)0x0) {
              iVar4 = coda_expression_eval_bool(expr,cursor,(int *)&local_4d0);
              if (iVar4 != 0) {
                coda_add_error_message
                          (" while evaluating definition expression for availability of field \'%s\'"
                           ,**(undefined8 **)(pcVar12[1].description + lVar11 * 8));
                pcVar8 = coda_errno_to_string(*piVar7);
                (*callbackfunc)(cursor,pcVar8,userdata);
                *piVar7 = 0;
              }
              goto LAB_001248c9;
            }
            local_4d0 = 0xffffffff;
LAB_00124951:
            uVar5 = 0xffffffff;
          }
          if ((local_4d4 != 0) && (uVar5 != 0)) {
            iVar4 = coda_type_get_record_field_real_name
                              ((coda_type *)local_348.product,
                               CONCAT44(local_4a8._4_4_,(int)local_4a8),(char **)&local_488);
            if (iVar4 != 0) {
              return -1;
            }
            local_458 = *(undefined8 **)(pcVar12[1].description + lVar11 * 8);
            local_450 = (char *)local_458[1];
            if (local_450 == (char *)0x0) {
              local_450 = (char *)*local_458;
            }
            local_460 = (char *)CONCAT44(local_488._4_4_,(coda_type_class)local_488);
            iVar4 = strcmp(local_460,local_450);
            if (iVar4 != 0) {
              coda_set_error(-300,"real name for field \'%s\' (%s) does not match definition (%s)",
                             *local_458,local_460,local_450);
              pcVar8 = coda_errno_to_string(*piVar7);
              (*callbackfunc)(cursor,pcVar8,userdata);
              *piVar7 = 0;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (long)pcVar12[1].name);
      }
      iVar4 = coda_cursor_get_num_elements(cursor,(long *)local_448);
      if (iVar4 != 0) {
        return -1;
      }
      if (0 < (long)local_448[0]) {
        piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
        lVar11 = 0;
        do {
          iVar4 = coda_type_get_record_field_name
                            ((coda_type *)local_348.product,lVar11,(char **)&local_4a8);
          if (iVar4 != 0) {
            return -1;
          }
          iVar4 = coda_type_get_record_field_index_from_name
                            (*definition,(char *)CONCAT44(local_4a8._4_4_,(int)local_4a8),&local_488
                            );
          if ((iVar4 != 0) && (*piVar7 == -0x66)) {
            coda_set_error(-300,
                           "field \'%s\' availability (available) does not match definition (not allowed)"
                           ,CONCAT44(local_4a8._4_4_,(int)local_4a8));
            pcVar8 = coda_errno_to_string(*piVar7);
            (*callbackfunc)(cursor,pcVar8,userdata);
            *piVar7 = 0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (long)local_448[0]);
      }
      break;
    case coda_array_class:
      pcVar12 = *definition;
      iVar4 = coda_cursor_get_array_dim(cursor,(int *)&local_4a8,(long *)&local_348);
      if (iVar4 != 0) {
        return -1;
      }
      if ((int)local_4a8 == *(int *)&pcVar12[1].name) {
        if (0 < (int)local_4a8) {
          piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
          lVar11 = 0;
          do {
            if ((long)(&pcVar12[1].description)[lVar11] < 0) {
              if ((coda_expression *)(&pcVar12[2].bit_size)[lVar11] != (coda_expression *)0x0) {
                iVar4 = coda_expression_eval_integer
                                  ((coda_expression *)(&pcVar12[2].bit_size)[lVar11],cursor,
                                   (int64_t *)local_448);
                if (iVar4 == 0) {
                  if (*(coda_type **)((long)local_348.stack + lVar11 * 8 + -0x10) == local_448[0])
                  goto LAB_00124cec;
                  coda_set_error(-300,"size of dim[%d] (%ld) does not match definition (%ld)");
                }
                else {
                  coda_add_error_message
                            (" while evaluating definition expression for dimension %d",lVar11);
                }
                pcVar8 = coda_errno_to_string(*piVar7);
                (*callbackfunc)(cursor,pcVar8,userdata);
                *piVar7 = 0;
              }
            }
            else if (*(char **)((long)local_348.stack + lVar11 * 8 + -0x10) !=
                     (&pcVar12[1].description)[lVar11]) {
              coda_set_error(-300,"size of dim[%d] (%ld) does not match definition (%ld)");
              pcVar8 = coda_errno_to_string(*piVar7);
              (*callbackfunc)(cursor,pcVar8,userdata);
              *piVar7 = 0;
            }
LAB_00124cec:
            lVar11 = lVar11 + 1;
          } while (lVar11 < (int)local_4a8);
        }
      }
      else {
        coda_set_error(-300,"number of dimensions (%d) does not match definition (%d)");
LAB_00125290:
        piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
        pcVar8 = coda_errno_to_string(*piVar7);
        (*callbackfunc)(cursor,pcVar8,userdata);
        *piVar7 = 0;
      }
      break;
    case coda_integer_class:
    case coda_real_class:
      iVar4 = coda_cursor_get_read_type(cursor,(coda_native_type *)&local_348);
      if (iVar4 != 0) {
        return -1;
      }
      if ((coda_special_type)local_348.product != (*definition)->read_type) {
        pcVar8 = coda_type_get_native_type_name((coda_special_type)local_348.product);
        coda_type_get_native_type_name((*definition)->read_type);
        coda_set_error(-300,"read type (%s) does not match definition (%s)",pcVar8);
        goto LAB_00125290;
      }
      break;
    case coda_special_class:
      iVar4 = coda_cursor_get_special_type(cursor,(coda_special_type *)&local_348);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = coda_type_get_special_type(*definition,(coda_special_type *)local_448);
      if (iVar4 != 0) {
        return -1;
      }
      if ((coda_special_type)local_348.product != (coda_special_type)local_448[0]) {
        local_4f8 = (uint8_t *)coda_type_get_special_type_name((coda_special_type)local_348.product)
        ;
        coda_type_get_special_type_name((coda_special_type)local_448[0]);
        pcVar8 = "special type (%s) does not match definition (%s)";
        goto LAB_0012449a;
      }
      goto LAB_001244e7;
    }
  }
  else {
    local_4f8 = (uint8_t *)coda_type_get_class_name(local_4c8);
    coda_type_get_class_name(local_4c0);
    pcVar8 = "type (%s) does not match definition (%s)";
LAB_0012449a:
    coda_set_error(-300,pcVar8,local_4f8);
    piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
    pcVar8 = coda_errno_to_string(*piVar7);
    (*callbackfunc)(cursor,pcVar8,userdata);
    *piVar7 = 0;
LAB_001244e7:
    *definition = (coda_type *)0x0;
  }
switchD_00124420_caseD_4:
  if ((size_check != 0) && (local_4b4 < (coda_special_class|coda_array_class))) {
    if ((0x3cU >> (local_4b4 & 0x1f) & 1) == 0) {
      *bit_size = 0;
    }
    else {
      iVar4 = coda_cursor_get_bit_size(cursor,bit_size);
      if (iVar4 != 0) {
        return -1;
      }
    }
  }
  if (read_check == 0) {
switchD_00124542_default:
    bVar3 = false;
  }
  else {
    switch(local_4b4) {
    case coda_integer_class:
    case coda_real_class:
      break;
    case coda_text_class:
      iVar4 = coda_cursor_get_string_length(cursor,(long *)&local_348);
      if (iVar4 != 0) {
LAB_0012474e:
        piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
        iVar4 = *piVar7;
        if ((1 < iVar4 + 0x68U) && (iVar4 != -300)) {
          return -1;
        }
        pcVar8 = coda_errno_to_string(iVar4);
LAB_00124d0c:
        (*callbackfunc)(cursor,pcVar8,userdata);
        bVar3 = true;
        goto LAB_00124d21;
      }
      if ((long)local_348.product < 0) {
        pcVar8 = "string length is negative";
        goto LAB_00124d0c;
      }
      pcVar12 = *definition;
      if (*definition == (coda_type *)0x0) {
        pcVar12 = local_4b0;
      }
      iVar4 = coda_type_get_fixed_value(pcVar12,(char **)local_448,&local_4a8);
      if (iVar4 != 0) {
        return -1;
      }
      if ((long)local_348.product < 1) {
        local_4f8 = (uint8_t *)0x0;
LAB_001252d7:
        if (local_448[0] != (coda_type *)0x0) {
          if (local_348.product == (coda_product_struct *)CONCAT44(local_4a8._4_4_,(int)local_4a8))
          {
            if (((long)local_348.product < 1) ||
               (iVar4 = bcmp(local_4f8,local_448[0],(size_t)local_348.product), iVar4 == 0))
            goto LAB_00125348;
            pcVar8 = "string data does not match fixed value";
          }
          else {
            pcVar8 = "string data does not match fixed value (length differs)";
          }
          (*callbackfunc)(cursor,pcVar8,userdata);
        }
LAB_00125348:
        if (local_4b0[1].type_class == coda_array_class) {
          switch((int)cursor->product[1].file_size) {
          case 0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                          ,0x1ce,
                          "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                         );
          case 1:
            pcVar8 = "invalid end of line sequence (expected newline)";
            if (local_348.product == (coda_product_struct *)0x1) {
              uVar1 = *local_4f8;
joined_r0x00125441:
              if (uVar1 == '\n') goto LAB_0012545c;
            }
            break;
          case 2:
            pcVar8 = "invalid end of line sequence (expected carriage return)";
            if ((local_348.product == (coda_product_struct *)0x1) && (*local_4f8 == '\r'))
            goto LAB_0012545c;
            break;
          case 3:
            pcVar8 = "invalid end of line sequence (expected carriage return followed by newline)";
            if ((local_348.product == (coda_product_struct *)0x2) && (*local_4f8 == '\r')) {
              uVar1 = local_4f8[1];
              goto joined_r0x00125441;
            }
            break;
          default:
            goto switchD_00125375_default;
          }
          (*callbackfunc)(cursor,pcVar8,userdata);
        }
switchD_00125375_default:
        if (local_4f8 != (uint8_t *)0x0) {
LAB_0012545c:
          free(local_4f8);
        }
LAB_00125461:
        bVar3 = false;
        goto LAB_00124d21;
      }
      __size = (coda_type *)((long)&(local_348.product)->filename + 1);
      local_4f8 = (uint8_t *)malloc((size_t)__size);
      if (local_4f8 != (uint8_t *)0x0) {
        iVar4 = coda_cursor_read_string(cursor,(char *)local_4f8,(long)__size);
        if (iVar4 != 0) goto LAB_001255db;
        goto LAB_001252d7;
      }
      uVar14 = 0x19b;
      goto LAB_001256a3;
    case coda_raw_class:
      if ((size_check == 0) && (iVar4 = coda_cursor_get_bit_size(cursor,bit_size), iVar4 != 0))
      goto LAB_0012474e;
      uVar15 = *bit_size;
      if ((long)uVar15 < 0) {
        pcVar8 = "bit size is negative";
        goto LAB_00124d0c;
      }
      __size = (coda_type *)(((uVar15 >> 3) + 1) - (ulong)((uVar15 & 7) == 0));
      pcVar12 = *definition;
      if (*definition == (coda_type *)0x0) {
        pcVar12 = local_4b0;
      }
      iVar4 = coda_type_get_fixed_value(pcVar12,(char **)&local_348,(long *)local_448);
      if (iVar4 != 0) {
        return -1;
      }
      bVar3 = false;
      if (local_348.product != (coda_product_struct *)0x0) {
        if (__size == local_448[0]) {
          if (__size == (coda_type *)0x0) goto LAB_00124d21;
          local_4f8 = (uint8_t *)malloc((size_t)__size);
          if (local_4f8 == (uint8_t *)0x0) {
            uVar14 = 0x20c;
            goto LAB_001256a3;
          }
          iVar4 = coda_cursor_read_bits(cursor,local_4f8,0,*bit_size);
          if (iVar4 != 0) goto LAB_001255db;
          iVar4 = bcmp(local_4f8,local_348.product,(size_t)local_448[0]);
          if (iVar4 != 0) {
            (*callbackfunc)(cursor,"data does not match fixed value (value differs)",userdata);
          }
          goto LAB_0012545c;
        }
        (*callbackfunc)(cursor,"data does not match fixed value (length differs)",userdata);
        goto LAB_00125461;
      }
      goto LAB_00124d21;
    case coda_special_class:
      bVar3 = false;
      iVar4 = coda_cursor_get_special_type(cursor,(coda_special_type *)local_448);
      if (iVar4 != 0) {
        return -1;
      }
      if ((coda_special_type)local_448[0] != 2) goto LAB_00124d21;
      break;
    default:
      goto switchD_00124542_default;
    }
    bVar3 = false;
    iVar4 = coda_cursor_read_double(cursor,(double *)&local_348);
    if (iVar4 != 0) {
      piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
      iVar4 = *piVar7;
      if ((1 < iVar4 + 0x68U) && (iVar4 != -300)) {
        return -1;
      }
      pcVar8 = coda_errno_to_string(iVar4);
      (*callbackfunc)(cursor,pcVar8,userdata);
    }
  }
LAB_00124d21:
  iVar4 = coda_cursor_has_attributes(cursor,(int *)&local_4d4);
  if (iVar4 != 0) {
    return -1;
  }
  pcVar12 = *definition;
  if (local_4d4 != 0) {
    local_348.product = (coda_product_struct *)0x0;
    if ((pcVar12 != (coda_type *)0x0) &&
       (iVar4 = coda_type_get_attributes(pcVar12,(coda_type **)&local_348), iVar4 != 0)) {
      return -1;
    }
    iVar4 = coda_cursor_goto_attributes(cursor);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = check_data(cursor,(coda_type **)&local_348,read_check,0,(int64_t *)local_448,
                       callbackfunc,userdata);
    if (iVar4 != 0) {
      return -1;
    }
    coda_cursor_goto_parent(cursor);
    pcVar12 = *definition;
    if ((pcVar12 != (coda_type *)0x0) && (local_348.product == (coda_product_struct *)0x0)) {
      *definition = (coda_type *)0x0;
      pcVar12 = (coda_type *)0x0;
    }
  }
  if ((size_check == 0 && read_check == 0) && pcVar12 == (coda_type *)0x0) {
LAB_00125540:
    if (((!bVar3 && size_check != 0) &&
        (pcVar2 = cursor->stack[(long)cursor->n + -1].type, pcVar2->backend == coda_backend_memory))
       && (pcVar2[1].backend == 2)) {
      lVar11 = *(long *)(pcVar2 + 2);
      product = cursor->product;
      lVar16 = *bit_size >> 3;
      uVar15 = (ulong)((uint)*bit_size & 7);
      if ((product->format != coda_format_xml) ||
         (lVar11 <= (long)((lVar16 + 1) - (ulong)(uVar15 == 0)))) {
        if ((lVar16 + 1) - (ulong)(uVar15 == 0) == lVar11) {
          return 0;
        }
        coda_str64(lVar11,(char *)local_448);
        coda_str64(lVar16,(char *)&local_4a8);
        if (uVar15 != 0) {
          sVar10 = strlen((char *)&local_4a8);
          sprintf((char *)((long)&local_4a8 + sVar10),":%d",uVar15);
        }
        sprintf((char *)&local_348,
                "incorrect block size (actual size %s does not match calculated size %s)",local_448,
                &local_4a8);
        (*callbackfunc)(cursor,(char *)&local_348,userdata);
        return 0;
      }
      pcVar12 = pcVar2[2].definition;
      __size = (coda_type *)(lVar11 - lVar16);
      local_4f8 = (uint8_t *)malloc((size_t)((long)&__size->format + 1));
      if (local_4f8 == (uint8_t *)0x0) {
        uVar14 = 0x37b;
        goto LAB_001256a3;
      }
      iVar4 = read_bytes(product,(long)&pcVar12->format + lVar16,(int64_t)__size,local_4f8);
      if (iVar4 != 0) {
LAB_001255db:
        free(local_4f8);
        return -1;
      }
      local_4f8[(long)__size] = '\0';
      if (0 < (long)__size) {
        pcVar12 = (coda_type *)0x0;
        do {
          if ((0x20 < (ulong)local_4f8[(long)pcVar12]) ||
             ((0x100002600U >> ((ulong)local_4f8[(long)pcVar12] & 0x3f) & 1) == 0)) {
            (*callbackfunc)(cursor,"non-whitespace trailing data found for xml content",userdata);
            break;
          }
          pcVar12 = (coda_type *)((long)&pcVar12->format + 1);
        } while (__size != pcVar12);
      }
      free(local_4f8);
    }
    iVar4 = 0;
  }
  else {
    if (local_4b4 == coda_record_class) {
      memcpy(&local_348,cursor,0x310);
      iVar4 = coda_cursor_get_num_elements(&local_348,(long *)&local_4c8);
      if (iVar4 != 0) {
        return -1;
      }
      if (0 < CONCAT44(uStack_4c4,local_4c8)) {
        iVar4 = coda_cursor_goto_first_record_field(cursor);
        if (iVar4 != 0) {
          return -1;
        }
        if (0 < CONCAT44(uStack_4c4,local_4c8)) {
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_001d9fb8);
          lVar11 = 0;
          do {
            local_448[0] = (coda_type *)0x0;
            iVar4 = coda_cursor_get_record_field_available_status
                              (&local_348,lVar11,(int *)&local_4d0);
            if (iVar4 != 0) {
              return -1;
            }
            if (local_4d0 != 0) {
              if (*definition != (coda_type *)0x0) {
                iVar4 = coda_type_get_record_field_name(local_4b0,lVar11,(char **)&local_4a8);
                if (iVar4 != 0) {
                  return -1;
                }
                iVar4 = coda_type_get_record_field_index_from_name
                                  (*definition,(char *)CONCAT44(local_4a8._4_4_,(int)local_4a8),
                                   &local_488);
                if (iVar4 == 0) {
                  iVar4 = coda_type_get_record_field_type
                                    (*definition,
                                     CONCAT44(local_488._4_4_,(coda_type_class)local_488),local_448)
                  ;
                  if (iVar4 != 0) {
                    return -1;
                  }
                }
                else {
                  *puVar9 = 0;
                }
              }
              iVar4 = check_data(cursor,local_448,read_check,size_check,(int64_t *)&local_4c0,
                                 callbackfunc,userdata);
              if (iVar4 != 0) {
                return -1;
              }
              if (size_check != 0) {
                *bit_size = *bit_size + CONCAT44(uStack_4bc,local_4c0);
              }
            }
            lVar16 = CONCAT44(uStack_4c4,local_4c8);
            if (lVar11 < lVar16 + -1) {
              iVar4 = coda_cursor_goto_next_record_field(cursor);
              if (iVar4 != 0) {
                return -1;
              }
              lVar16 = CONCAT44(uStack_4c4,local_4c8);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < lVar16);
        }
        coda_cursor_goto_parent(cursor);
      }
      if ((size_check != 0) && (local_4b0->size_expr != (coda_expression *)0x0)) {
        iVar4 = coda_get_option_use_fast_size_expressions();
        coda_set_option_use_fast_size_expressions(1);
        iVar6 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_4d0);
        if (iVar6 == 0) {
          if (*bit_size != CONCAT44(uStack_4cc,local_4d0)) {
            coda_str64(*bit_size >> 3,(char *)&local_4a8);
            uVar15 = *bit_size;
            if ((uVar15 & 7) != 0) {
              sVar10 = strlen((char *)&local_4a8);
              sprintf((char *)((long)&local_4a8 + sVar10),":%d",uVar15 & 7);
            }
            coda_str64(CONCAT44(uStack_4cc,local_4d0) >> 3,(char *)&local_488);
            uVar15 = (ulong)local_4d0;
            if ((local_4d0 & 7) != 0) {
              sVar10 = strlen((char *)&local_488);
              sprintf((char *)((long)&local_488 + sVar10),":%d",uVar15 & 7);
            }
            sprintf((char *)local_448,
                    "invalid result for record size expression (actual record size %s does not match expression result %s)"
                    ,&local_4a8,&local_488);
            (*callbackfunc)(cursor,(char *)local_448,userdata);
          }
        }
        else {
          piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
          pcVar8 = coda_errno_to_string(*piVar7);
          (*callbackfunc)(cursor,pcVar8,userdata);
          bVar3 = true;
        }
        coda_set_option_use_fast_size_expressions(iVar4);
      }
      goto LAB_00125540;
    }
    if (local_4b4 == coda_special_class) {
      local_348.product = (coda_product_struct *)0x0;
      iVar4 = coda_cursor_get_special_type(cursor,(coda_special_type *)local_448);
      if (iVar4 != 0) {
        return -1;
      }
      if ((coda_special_type)local_448[0] == 0) {
        __assert_fail("special_type != coda_special_no_data",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                      ,0x346,
                      "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                     );
      }
      if ((*definition != (coda_type *)0x0) &&
         (iVar4 = coda_type_get_special_base_type(*definition,(coda_type **)&local_348), iVar4 != 0)
         ) {
        return -1;
      }
      iVar4 = coda_cursor_use_base_type_of_special_type(cursor);
      if (iVar4 != 0) {
        return -1;
      }
      iVar4 = check_data(cursor,(coda_type **)&local_348,read_check,size_check,bit_size,callbackfunc
                         ,userdata);
      if (iVar4 != 0) {
        return -1;
      }
      goto LAB_00125540;
    }
    if (local_4b4 != coda_array_class) goto LAB_00125540;
    local_348.product = (coda_product_struct *)0x0;
    if ((pcVar12 != (coda_type *)0x0) &&
       (iVar4 = coda_type_get_array_base_type(pcVar12,(coda_type **)&local_348), iVar4 != 0)) {
      return -1;
    }
    iVar4 = coda_cursor_get_num_elements(cursor,(long *)local_448);
    if (iVar4 != 0) {
      return -1;
    }
    if ((long)local_448[0] < 1) goto LAB_00125540;
    iVar4 = coda_cursor_goto_first_array_element(cursor);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = coda_cursor_get_type(cursor,(coda_type **)&local_4a8);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = coda_type_get_class((coda_type *)CONCAT44(local_4a8._4_4_,(int)local_4a8),
                                (coda_type_class *)&local_488);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = coda_type_get_format((coda_type *)CONCAT44(local_4a8._4_4_,(int)local_4a8),&local_4c8);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = coda_cursor_get_bit_size(cursor,(int64_t *)&local_4c0);
    if (iVar4 != 0) {
      return -1;
    }
    if ((long)local_448[0] < 2 || (local_4c8 != coda_text_class || read_check == 0)) {
      if (0 < (long)local_448[0]) goto LAB_0012572d;
LAB_001257b3:
      coda_cursor_goto_parent(cursor);
LAB_001257bb:
      if ((*definition != (coda_type *)0x0) && (local_348.product == (coda_product_struct *)0x0)) {
        *definition = (coda_type *)0x0;
      }
      goto LAB_00125540;
    }
    if (((coda_type_class)local_488 & ~coda_array_class) != coda_integer_class) {
LAB_0012572d:
      local_4f0 = 0;
      do {
        iVar4 = check_data(cursor,(coda_type **)&local_348,read_check,size_check,
                           (int64_t *)&local_4c0,callbackfunc,userdata);
        if (iVar4 != 0) {
          return -1;
        }
        if (size_check != 0) {
          *bit_size = *bit_size + CONCAT44(uStack_4bc,local_4c0);
        }
        if ((local_4f0 < (long)((long)&local_448[0][-1].attributes + 7)) &&
           (iVar4 = coda_cursor_goto_next_array_element(cursor), iVar4 != 0)) {
          return -1;
        }
        local_4f0 = local_4f0 + 1;
      } while (local_4f0 < (long)local_448[0]);
      goto LAB_001257b3;
    }
    if (size_check != 0) {
      __assert_fail("size_check == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                    ,0x297,
                    "int check_data(coda_cursor *, coda_type **, int, int, int64_t *, void (*)(coda_cursor *, const char *, void *), void *)"
                   );
    }
    iVar4 = check_data(cursor,(coda_type **)&local_348,0,0,(int64_t *)&local_4c0,callbackfunc,
                       userdata);
    if (iVar4 != 0) {
      return -1;
    }
    coda_cursor_goto_parent(cursor);
    __size = (coda_type *)((long)local_448[0] << 3);
    dst = (double *)malloc((size_t)__size);
    if (dst != (double *)0x0) {
      iVar4 = coda_cursor_read_double_array(cursor,dst,coda_array_ordering_c);
      if (iVar4 != 0) {
        piVar7 = (int *)__tls_get_addr(&PTR_001d9fb8);
        iVar4 = *piVar7;
        if ((1 < iVar4 + 0x68U) && (iVar4 != -300)) {
          return -1;
        }
        pcVar8 = coda_errno_to_string(iVar4);
        (*callbackfunc)(cursor,pcVar8,userdata);
      }
      free(dst);
      goto LAB_001257bb;
    }
    uVar14 = 0x2a5;
LAB_001256a3:
    iVar4 = -1;
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-check.c"
                   ,uVar14);
  }
  return iVar4;
}

Assistant:

static int check_data(coda_cursor *cursor, coda_type **definition, int read_check, int size_check, int64_t *bit_size,
                      void (*callbackfunc)(coda_cursor *, const char *, void *), void *userdata)
{
    coda_type_class type_class;
    int skip_mem_size_check = 0;
    int has_attributes;
    coda_type *type;

    /* even if size_check==0 we need bit_size!=NULL because for some cases sizes are still calculated */
    assert(bit_size != NULL);

    if (coda_cursor_get_type(cursor, &type) != 0)
    {
        return -1;
    }
    if (coda_type_get_class(type, &type_class) != 0)
    {
        return -1;
    }

    /* check definition */
    if (check_definition(cursor, definition, callbackfunc, userdata) != 0)
    {
        return -1;
    }

    /* check bit size */
    if (size_check)
    {
        switch (type_class)
        {
            case coda_array_class:
            case coda_record_class:
            case coda_special_class:
                /* start with size=0 and have traversal below add size of sub element(s) */
                *bit_size = 0;
                break;
            case coda_integer_class:
            case coda_real_class:
            case coda_text_class:
            case coda_raw_class:
                if (coda_cursor_get_bit_size(cursor, bit_size) != 0)
                {
                    return -1;
                }
                break;
        }
    }

    /* try to read data */
    if (read_check)
    {
        switch (type_class)
        {
            case coda_array_class:
            case coda_record_class:
                break;
            case coda_integer_class:
            case coda_real_class:
                {
                    double value;

                    if (coda_cursor_read_double(cursor, &value) != 0)
                    {
                        if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                            coda_errno != CODA_ERROR_INVALID_DATETIME)
                        {
                            return -1;
                        }
                        callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                        /* just continue checking the remaining file */
                    }
                }
                break;
            case coda_text_class:
                {
                    char *data = NULL;
                    long string_length;
                    const char *fixed_value;
                    long fixed_value_length;

                    if (coda_cursor_get_string_length(cursor, &string_length) != 0)
                    {
                        if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                            coda_errno != CODA_ERROR_INVALID_DATETIME)
                        {
                            return -1;
                        }
                        callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                        /* if we can't determine the string length, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }
                    if (string_length < 0)
                    {
                        callbackfunc(cursor, "string length is negative", userdata);
                        /* if we can't determine a proper string length, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }

                    if (coda_type_get_fixed_value(*definition != NULL ? *definition : type, &fixed_value,
                                                  &fixed_value_length) != 0)
                    {
                        return -1;
                    }

                    if (string_length > 0)
                    {
                        data = (char *)malloc(string_length + 1);
                        if (data == NULL)
                        {
                            coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                           "out of memory (could not allocate %lu bytes) (%s:%u)", string_length + 1,
                                           __FILE__, __LINE__);
                            return -1;
                        }
                        if (coda_cursor_read_string(cursor, data, string_length + 1) != 0)
                        {
                            free(data);
                            return -1;
                        }
                    }

                    if (fixed_value != NULL)
                    {
                        if (string_length != fixed_value_length)
                        {
                            callbackfunc(cursor, "string data does not match fixed value (length differs)", userdata);
                            /* we do not return -1; we can just continue checking the rest of the file */
                        }
                        else if (string_length > 0)
                        {
                            if (memcmp(data, fixed_value, fixed_value_length) != 0)
                            {
                                callbackfunc(cursor, "string data does not match fixed value", userdata);
                                /* we do not return -1; we can just continue checking the rest of the file */
                            }
                        }
                    }
                    if (((coda_type_text *)type)->special_text_type == ascii_text_line_separator)
                    {
                        switch (((coda_ascii_product *)cursor->product)->end_of_line)
                        {
                            case eol_lf:
                                if (string_length != 1 || data[0] != '\n')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected newline)", userdata);
                                }
                                break;
                            case eol_cr:
                                if (string_length != 1 || data[0] != '\r')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected carriage return)",
                                                 userdata);
                                }
                                break;
                            case eol_crlf:
                                if (string_length != 2 || data[0] != '\r' || data[1] != '\n')
                                {
                                    callbackfunc(cursor, "invalid end of line sequence (expected carriage return "
                                                 "followed by newline)", userdata);
                                }
                                break;
                            case eol_unknown:
                                assert(0);
                                exit(1);
                        }
                    }

                    if (data != NULL)
                    {
                        free(data);
                    }
                }
                break;
            case coda_raw_class:
                {
                    int64_t byte_size;
                    const char *fixed_value;
                    long fixed_value_length;

                    if (!size_check)
                    {
                        if (coda_cursor_get_bit_size(cursor, bit_size) != 0)
                        {
                            if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                coda_errno != CODA_ERROR_INVALID_DATETIME)
                            {
                                return -1;
                            }
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            /* if we can't determine the bit size, don't try to read the data */
                            skip_mem_size_check = 1;
                            break;
                        }
                    }
                    if (*bit_size < 0)
                    {
                        callbackfunc(cursor, "bit size is negative", userdata);
                        /* if we can't determine a proper size, don't try to read the data */
                        skip_mem_size_check = 1;
                        break;
                    }
                    byte_size = (*bit_size >> 3) + (*bit_size & 0x7 ? 1 : 0);

                    if (coda_type_get_fixed_value(*definition != NULL ? *definition : type, &fixed_value,
                                                  &fixed_value_length) != 0)
                    {
                        return -1;
                    }
                    if (fixed_value != NULL)
                    {
                        if (byte_size != fixed_value_length)
                        {
                            callbackfunc(cursor, "data does not match fixed value (length differs)", userdata);
                            /* we do not return -1; we can just continue checking the rest of the file */
                        }
                        else if (fixed_value_length > 0)
                        {
                            uint8_t *data;

                            data = (uint8_t *)malloc((size_t)byte_size);
                            if (data == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)", (long)byte_size,
                                               __FILE__, __LINE__);
                                return -1;
                            }
                            if (coda_cursor_read_bits(cursor, data, 0, *bit_size) != 0)
                            {
                                free(data);
                                return -1;
                            }
                            if (memcmp(data, fixed_value, fixed_value_length) != 0)
                            {
                                callbackfunc(cursor, "data does not match fixed value (value differs)", userdata);
                                /* we do not return -1; we can just continue checking the rest of the file */
                            }
                            free(data);
                        }
                    }
                }
                break;
            case coda_special_class:
                {
                    coda_special_type special_type;

                    if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                    {
                        return -1;
                    }

                    if (special_type == coda_special_time)
                    {
                        double value;

                        /* try to read the time value as a double */
                        if (coda_cursor_read_double(cursor, &value) != 0)
                        {
                            if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                coda_errno != CODA_ERROR_INVALID_DATETIME)
                            {
                                return -1;
                            }
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            /* just continue checking the remaining file */
                        }
                    }
                }
                break;
        }
    }

    /* check attributes */
    if (coda_cursor_has_attributes(cursor, &has_attributes) != 0)
    {
        return -1;
    }
    if (has_attributes)
    {
        coda_type *attributes_definition = NULL;
        int64_t attribute_size;

        if (*definition != NULL)
        {
            if (coda_type_get_attributes(*definition, &attributes_definition) != 0)
            {
                return -1;
            }
        }
        if (coda_cursor_goto_attributes(cursor) != 0)
        {
            return -1;
        }
        if (check_data(cursor, &attributes_definition, read_check, 0, &attribute_size, callbackfunc, userdata) != 0)
        {
            return -1;
        }
        coda_cursor_goto_parent(cursor);
        if (*definition != NULL && attributes_definition == NULL)
        {
            *definition = NULL;
        }
    }

    /* traverse sub-elements */
    if (*definition != NULL || read_check || size_check)
    {
        int64_t sub_bit_size;

        switch (type_class)
        {
            case coda_array_class:
                {
                    coda_type *base_definition = NULL;
                    long num_elements;
                    long i;

                    if (*definition != NULL)
                    {
                        if (coda_type_get_array_base_type(*definition, &base_definition) != 0)
                        {
                            return -1;
                        }
                    }
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }
                    if (num_elements > 0)
                    {
                        coda_type *array_element_type;
                        coda_type_class array_element_type_class;
                        coda_format array_element_type_format;

                        if (coda_cursor_goto_first_array_element(cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_type(cursor, &array_element_type) != 0)
                        {
                            return -1;
                        }
                        if (coda_type_get_class(array_element_type, &array_element_type_class) != 0)
                        {
                            return -1;
                        }
                        if (coda_type_get_format(array_element_type, &array_element_type_format) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(cursor, &sub_bit_size) != 0)
                        {
                            return -1;
                        }
                        /* Reading data element-by-element from a HDF5 datafile takes a long time for large datasets
                         * so for large blocks of integers or doubles in HDF5 format we check the first array element
                         * without reading it and then read the whole array in one action. */
                        if (read_check && array_element_type_format == coda_format_hdf5 && num_elements > 1 &&
                            (array_element_type_class == coda_integer_class ||
                             array_element_type_class == coda_real_class))
                        {
                            double *values;

                            assert(size_check == 0);

                            /* only perform type check for the first array element */
                            if (check_data(cursor, &base_definition, 0, 0, &sub_bit_size, callbackfunc, userdata) != 0)
                            {
                                return -1;
                            }
                            coda_cursor_goto_parent(cursor);

                            values = malloc(num_elements * sizeof(double));
                            if (values == NULL)
                            {
                                coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                               "out of memory (could not allocate %lu bytes) (%s:%u)",
                                               (long)(num_elements * sizeof(double)), __FILE__, __LINE__);
                                return -1;
                            }
                            if (coda_cursor_read_double_array(cursor, values, coda_array_ordering_c) != 0)
                            {
                                if (coda_errno != CODA_ERROR_PRODUCT && coda_errno != CODA_ERROR_INVALID_FORMAT &&
                                    coda_errno != CODA_ERROR_INVALID_DATETIME)
                                {
                                    return -1;
                                }
                                callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            }
                            free(values);
                        }
                        else
                        {
                            for (i = 0; i < num_elements; i++)
                            {
                                if (check_data(cursor, &base_definition, read_check, size_check, &sub_bit_size,
                                               callbackfunc, userdata) != 0)
                                {
                                    return -1;
                                }
                                if (size_check)
                                {
                                    *bit_size += sub_bit_size;
                                }
                                if (i < num_elements - 1)
                                {
                                    if (coda_cursor_goto_next_array_element(cursor) != 0)
                                    {
                                        return -1;
                                    }
                                }
                            }
                            coda_cursor_goto_parent(cursor);
                        }
                        if (*definition != NULL && base_definition == NULL)
                        {
                            *definition = NULL;
                        }
                    }
                }
                break;
            case coda_record_class:
                {
                    coda_cursor record_cursor = *cursor;
                    long num_elements;
                    long i;

                    if (coda_cursor_get_num_elements(&record_cursor, &num_elements) != 0)
                    {
                        return -1;
                    }
                    if (num_elements > 0)
                    {
                        if (coda_cursor_goto_first_record_field(cursor) != 0)
                        {
                            return -1;
                        }
                        for (i = 0; i < num_elements; i++)
                        {
                            coda_type *field_definition = NULL;
                            int available;

                            if (coda_cursor_get_record_field_available_status(&record_cursor, i, &available) != 0)
                            {
                                return -1;
                            }
                            if (available)
                            {
                                if (*definition != NULL)
                                {
                                    const char *field_name;
                                    long index;

                                    if (coda_type_get_record_field_name(type, i, &field_name) != 0)
                                    {
                                        return -1;
                                    }
                                    if (coda_type_get_record_field_index_from_name(*definition, field_name, &index) !=
                                        0)
                                    {
                                        /* allow field to not be available in definition -> field_definition=NULL */
                                        coda_errno = 0;
                                    }
                                    else if (coda_type_get_record_field_type(*definition, index, &field_definition) !=
                                             0)
                                    {
                                        return -1;
                                    }
                                }
                                if (check_data(cursor, &field_definition, read_check, size_check, &sub_bit_size,
                                               callbackfunc, userdata) != 0)
                                {
                                    return -1;
                                }
                                if (size_check)
                                {
                                    *bit_size += sub_bit_size;
                                }
                            }
                            if (i < num_elements - 1)
                            {
                                if (coda_cursor_goto_next_record_field(cursor) != 0)
                                {
                                    return -1;
                                }
                            }
                        }
                        coda_cursor_goto_parent(cursor);
                    }
                    if (size_check && ((coda_type_record *)type)->size_expr != NULL)
                    {
                        int64_t fast_size;
                        int prev_option_value = coda_get_option_use_fast_size_expressions();

                        coda_set_option_use_fast_size_expressions(1);
                        if (coda_cursor_get_bit_size(cursor, &fast_size) != 0)
                        {
                            callbackfunc(cursor, coda_errno_to_string(coda_errno), userdata);
                            skip_mem_size_check = 1;
                        }
                        else if (*bit_size != fast_size)
                        {
                            char error_message[256];
                            char s1[30];
                            char s2[30];

                            coda_str64((*bit_size) >> 3, s1);
                            if (*bit_size & 0x7)
                            {
                                sprintf(&s1[strlen(s1)], ":%d", (int)((*bit_size) & 0x7));
                            }
                            coda_str64(fast_size >> 3, s2);
                            if (fast_size & 0x7)
                            {
                                sprintf(&s2[strlen(s2)], ":%d", (int)(fast_size & 0x7));
                            }
                            sprintf(error_message, "invalid result for record size expression (actual record size %s "
                                    "does not match expression result %s)", s1, s2);
                            callbackfunc(cursor, error_message, userdata);
                        }
                        coda_set_option_use_fast_size_expressions(prev_option_value);
                    }
                }
                break;
            case coda_integer_class:
            case coda_real_class:
            case coda_text_class:
            case coda_raw_class:
                break;
            case coda_special_class:
                {
                    coda_special_type special_type;
                    coda_type *base_definition = NULL;

                    if (coda_cursor_get_special_type(cursor, &special_type) != 0)
                    {
                        return -1;
                    }
                    assert(special_type != coda_special_no_data);

                    if (*definition != NULL)
                    {
                        if (coda_type_get_special_base_type(*definition, &base_definition) != 0)
                        {
                            return -1;
                        }
                    }
                    if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
                    {
                        return -1;
                    }
                    if (check_data(cursor, &base_definition, read_check, size_check, bit_size, callbackfunc,
                                   userdata) != 0)
                    {
                        return -1;
                    }
                }
                break;
        }
    }

    /* additional size test for mem backend */
    if (size_check && !skip_mem_size_check && cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        if (((coda_mem_type *)cursor->stack[cursor->n - 1].type)->tag == tag_mem_data)
        {
            int64_t expected_byte_size = ((coda_mem_data *)cursor->stack[cursor->n - 1].type)->length;
            int64_t calculated_bit_size = 0;

            if (bit_size != NULL)
            {
                calculated_bit_size = *bit_size;
            }
            else if (coda_cursor_get_bit_size(cursor, &calculated_bit_size) != 0)
            {
                return -1;
            }
            if (cursor->product->format == coda_format_xml &&
                bit_size_to_byte_size(calculated_bit_size) < expected_byte_size)
            {
                long offset = (long)((coda_mem_data *)cursor->stack[cursor->n - 1].type)->offset;
                int64_t byte_size = expected_byte_size - (calculated_bit_size >> 3);
                char *data;
                long i;

                /* verify that trailing data consists of only whitespace */
                data = (char *)malloc((size_t)byte_size + 1);
                if (data == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY,
                                   "out of memory (could not allocate %lu bytes) (%s:%u)", (long)byte_size,
                                   __FILE__, __LINE__);
                    return -1;
                }
                if (read_bytes(cursor->product, offset + (calculated_bit_size >> 3), byte_size, (uint8_t *)data) != 0)
                {
                    free(data);
                    return -1;
                }
                data[byte_size] = '\0';
                for (i = 0; i < byte_size; i++)
                {
                    if (data[i] != ' ' && data[i] != '\t' && data[i] != '\n' && data[i] != '\r')
                    {
                        callbackfunc(cursor, "non-whitespace trailing data found for xml content", userdata);
                        break;
                    }
                }
                free(data);
            }
            else if (bit_size_to_byte_size(calculated_bit_size) != expected_byte_size)
            {
                char error_message[256];
                char s1[30];
                char s2[30];

                coda_str64(expected_byte_size, s1);
                coda_str64(calculated_bit_size >> 3, s2);
                if (calculated_bit_size & 0x7)
                {
                    sprintf(&s2[strlen(s2)], ":%d", (int)(calculated_bit_size & 0x7));
                }
                sprintf(error_message, "incorrect block size (actual size %s does not match calculated size %s)",
                        s1, s2);
                callbackfunc(cursor, error_message, userdata);
                /* just continue checking the remaining file */
            }
        }
    }

    return 0;
}